

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O3

int file_open_write(file_t *file,char *filename)

{
  int iVar1;
  
  if (file == (file_t *)0x0) {
    __assert_fail("file != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/file.c",0x60,
                  "int file_open_write(file_t *, char *)");
  }
  if (filename != (char *)0x0) {
    if ((*filename == '-') && (filename[1] == '\0')) {
      file->fd = 1;
    }
    else {
      iVar1 = open(filename,0x241,0x1a4);
      file->fd = iVar1;
      if (iVar1 < 0) {
        perror("open");
        return 0;
      }
    }
    file->offset = 0;
    return 1;
  }
  __assert_fail("filename != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/file.c",0x61,
                "int file_open_write(file_t *, char *)");
}

Assistant:

int file_open_write(file_t *file, char *filename) {
  assert(file != NULL);
  assert(filename != NULL);

  if (!strcmp(filename, "-"))
    /* write to stdout */
    file->fd = STDOUT_FILENO;
  else {
    file->fd = open(filename, O_WRONLY | O_CREAT | O_TRUNC,
                    S_IRUSR | S_IWUSR | S_IRGRP | S_IROTH);

    if (file->fd < 0) {
      perror("open");
      return 0;
    }
  }

  file->offset = 0;

  return 1;
}